

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O0

void read_coeff(tran_low_t *coeff,intptr_t offset,__m256i *c)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 (*in_RDX) [32];
  long in_RSI;
  long in_RDI;
  __m256i y;
  __m256i x1;
  __m256i x0;
  tran_low_t *addr;
  
  pauVar1 = (undefined1 (*) [32])(in_RDI + in_RSI * 4);
  auVar2 = vpackssdw_avx2(*pauVar1,pauVar1[1]);
  auVar2 = vpermq_avx2(auVar2,0xd8);
  *in_RDX = auVar2;
  return;
}

Assistant:

static inline void read_coeff(const tran_low_t *coeff, intptr_t offset,
                              __m128i *c0, __m128i *c1) {
  const tran_low_t *addr = coeff + offset;
  if (sizeof(tran_low_t) == 4) {
    const __m128i x0 = _mm_load_si128((const __m128i *)addr);
    const __m128i x1 = _mm_load_si128((const __m128i *)addr + 1);
    const __m128i x2 = _mm_load_si128((const __m128i *)addr + 2);
    const __m128i x3 = _mm_load_si128((const __m128i *)addr + 3);
    *c0 = _mm_packs_epi32(x0, x1);
    *c1 = _mm_packs_epi32(x2, x3);
  } else {
    *c0 = _mm_load_si128((const __m128i *)addr);
    *c1 = _mm_load_si128((const __m128i *)addr + 1);
  }
}